

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode process_zlib_error(Curl_easy *data,z_stream *z)

{
  z_stream *z_local;
  Curl_easy *data_local;
  
  if (z->msg == (char *)0x0) {
    Curl_failf(data,
               "Error while processing content unencoding: Unknown failure within decompression software."
              );
  }
  else {
    Curl_failf(data,"Error while processing content unencoding: %s",z->msg);
  }
  return CURLE_BAD_CONTENT_ENCODING;
}

Assistant:

static CURLcode
process_zlib_error(struct Curl_easy *data, z_stream *z)
{
  if(z->msg)
    failf(data, "Error while processing content unencoding: %s",
          z->msg);
  else
    failf(data, "Error while processing content unencoding: "
          "Unknown failure within decompression software.");

  return CURLE_BAD_CONTENT_ENCODING;
}